

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureWrapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureWrapTests::init(TextureWrapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  Context *pCVar2;
  bool bVar3;
  CompressedTexFormat CVar4;
  CompressedTexFormat format;
  TestCaseGroup *pTVar5;
  TextureWrapCase *pTVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool *__rhs;
  long lVar10;
  long lVar11;
  allocator<char> local_1b1;
  string name;
  anon_struct_16_3_1dd0bf0d formatSizes [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string name_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  IVec3 blockSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).m_context,"rgba8",
             glcts::fixed_sample_locations_values + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        lVar7 = 0;
        while( true ) {
          if (lVar7 == 0x20) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&potFilenames,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&npotFilenames);
          std::operator+(&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &potFilenames,init::wrapModes[lVar8].name);
          std::operator+(&local_160,&local_a8,"_");
          std::operator+(&local_118,&local_160,init::wrapModes[lVar10].name);
          std::operator+(&local_f8,&local_118,"_");
          std::operator+(&name_4,&local_f8,*(char **)((long)&init::filteringModes[0].name + lVar7));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         formatSizes,&name_4,"_");
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               formatSizes,init::rgba8Sizes[lVar11].name);
          std::__cxx11::string::~string((string *)formatSizes);
          std::__cxx11::string::~string((string *)&name_4);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&potFilenames);
          pTVar6 = (TextureWrapCase *)operator_new(0x140);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar7);
          TextureWrapCase::TextureWrapCase
                    (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
                     ,pCVar2->m_renderCtx,pCVar2->m_contextInfo,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,0x1908,0x1401,
                     init::wrapModes[lVar8].mode,init::wrapModes[lVar10].mode,dVar1,dVar1,
                     init::rgba8Sizes[lVar11].width,init::rgba8Sizes[lVar11].height);
          tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar6);
          std::__cxx11::string::~string((string *)&name);
          lVar7 = lVar7 + 0x10;
        }
      }
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).m_context,"etc1",
             glcts::fixed_sample_locations_values + 1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"data/etc1/photo_helsinki_mip_0.pkm",(allocator<char> *)formatSizes);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
             &name);
  std::__cxx11::string::~string((string *)&name);
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      lVar10 = 0;
      while( true ) {
        if (lVar10 == 0x20) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&npotFilenames);
        std::operator+(&local_160,&local_a8,init::wrapModes[lVar11].name);
        std::operator+(&local_118,&local_160,"_");
        std::operator+(&local_f8,&local_118,init::wrapModes[lVar8].name);
        std::operator+(&name_4,&local_f8,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       formatSizes,&name_4,*(char **)((long)&init::filteringModes[0].name + lVar10))
        ;
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             formatSizes,"_pot");
        std::__cxx11::string::~string((string *)formatSizes);
        std::__cxx11::string::~string((string *)&name_4);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_a8);
        pTVar6 = (TextureWrapCase *)operator_new(0x140);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar10);
        TextureWrapCase::TextureWrapCase
                  (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pCVar2->m_renderCtx,pCVar2->m_contextInfo,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,init::wrapModes[lVar11].mode,
                   init::wrapModes[lVar8].mode,dVar1,dVar1,&potFilenames);
        tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar6);
        std::__cxx11::string::~string((string *)&name);
        lVar10 = lVar10 + 0x10;
      }
    }
  }
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"data/etc1/photo_helsinki_113x89.pkm",(allocator<char> *)formatSizes);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&npotFilenames,
             &name);
  std::__cxx11::string::~string((string *)&name);
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      lVar10 = 0;
      while( true ) {
        if (lVar10 == 0x20) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,glcts::fixed_sample_locations_values + 1,
                   (allocator<char> *)&local_50);
        std::operator+(&local_160,&local_a8,init::wrapModes[lVar11].name);
        std::operator+(&local_118,&local_160,"_");
        std::operator+(&local_f8,&local_118,init::wrapModes[lVar8].name);
        std::operator+(&name_4,&local_f8,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       formatSizes,&name_4,*(char **)((long)&init::filteringModes[0].name + lVar10))
        ;
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             formatSizes,"_npot");
        std::__cxx11::string::~string((string *)formatSizes);
        std::__cxx11::string::~string((string *)&name_4);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_a8);
        pTVar6 = (TextureWrapCase *)operator_new(0x140);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar10);
        TextureWrapCase::TextureWrapCase
                  (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pCVar2->m_renderCtx,pCVar2->m_contextInfo,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,init::wrapModes[lVar11].mode,
                   init::wrapModes[lVar8].mode,dVar1,dVar1,&npotFilenames);
        tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar6);
        std::__cxx11::string::~string((string *)&name);
        lVar10 = lVar10 + 0x10;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&npotFilenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&potFilenames);
  for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
    pTVar5 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar5,(this->super_TestCaseGroup).m_context,init::etc2Formats[lVar11].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
          lVar9 = 0;
          while( true ) {
            if (lVar9 == 0x20) break;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&potFilenames,glcts::fixed_sample_locations_values + 1,
                       (allocator<char> *)&npotFilenames);
            std::operator+(&local_a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &potFilenames,init::wrapModes[lVar10].name);
            std::operator+(&local_160,&local_a8,"_");
            std::operator+(&local_118,&local_160,init::wrapModes[lVar7].name);
            std::operator+(&local_f8,&local_118,"_");
            std::operator+(&name_4,&local_f8,*(char **)((long)&init::filteringModes[0].name + lVar9)
                          );
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           formatSizes,&name_4,"_");
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)formatSizes,init::etc2Sizes[lVar8].name);
            std::__cxx11::string::~string((string *)formatSizes);
            std::__cxx11::string::~string((string *)&name_4);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&potFilenames);
            pTVar6 = (TextureWrapCase *)operator_new(0x140);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar9);
            TextureWrapCase::TextureWrapCase
                      (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                              m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
                       name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                       init::etc2Formats[lVar11].format,init::wrapModes[lVar10].mode,
                       init::wrapModes[lVar7].mode,dVar1,dVar1,init::etc2Sizes[lVar8].width,
                       init::etc2Sizes[lVar8].height);
            tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar6);
            std::__cxx11::string::~string((string *)&name);
            lVar9 = lVar9 + 0x10;
          }
        }
      }
    }
  }
  format = COMPRESSEDTEXFORMAT_ETC1_RGB8;
  CVar4 = 0x1e290b0;
  while( true ) {
    if (format == COMPRESSEDTEXFORMAT_LAST) break;
    bVar3 = tcu::isAstcFormat(format);
    if (bVar3) {
      tcu::getBlockPixelSize((tcu *)&blockSize,format);
      local_a8._M_dataplus._M_p._0_4_ = blockSize.m_data[0];
      de::toString<int>(&local_118,(int *)&local_a8);
      std::operator+(&local_f8,"astc_",&local_118);
      std::operator+(&name_4,&local_f8,"x");
      potFilenames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(potFilenames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,blockSize.m_data[1]);
      de::toString<int>(&local_160,(int *)&potFilenames);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     formatSizes,&name_4,&local_160);
      bVar3 = tcu::isAstcSRGBFormat(format);
      __rhs = glcts::fixed_sample_locations_values + 1;
      if (bVar3) {
        __rhs = (bool *)0x1857fd3;
      }
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           formatSizes,__rhs);
      std::__cxx11::string::~string((string *)formatSizes);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&name_4);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      pTVar5 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar5,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
      formatSizes[0].name = "divisible";
      formatSizes[0].width = blockSize.m_data[0] * 10;
      formatSizes[0].height = blockSize.m_data[1] * 10;
      formatSizes[1].name = "not_divisible";
      formatSizes[1].width = formatSizes[0].width + 1;
      formatSizes[1].height = formatSizes[0].height + 1;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 0x10) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_1b1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &npotFilenames,&local_50,init::wrapModes[lVar8].name);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &potFilenames,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &npotFilenames,"_");
              std::operator+(&local_a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &potFilenames,init::wrapModes[lVar10].name);
              std::operator+(&local_160,&local_a8,"_");
              std::operator+(&local_118,&local_160,
                             *(char **)((long)&init::filteringModes[0].name + lVar7));
              std::operator+(&local_f8,&local_118,"_");
              std::operator+(&name_4,&local_f8,formatSizes[lVar11].name);
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_160);
              std::__cxx11::string::~string((string *)&local_a8);
              std::__cxx11::string::~string((string *)&potFilenames);
              std::__cxx11::string::~string((string *)&npotFilenames);
              std::__cxx11::string::~string((string *)&local_50);
              pTVar6 = (TextureWrapCase *)operator_new(0x140);
              pCVar2 = (this->super_TestCaseGroup).m_context;
              dVar1 = *(deUint32 *)((long)&init::filteringModes[0].mode + lVar7);
              TextureWrapCase::TextureWrapCase
                        (pTVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
                         name_4._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,format,
                         init::wrapModes[lVar8].mode,init::wrapModes[lVar10].mode,dVar1,dVar1,
                         formatSizes[lVar11].width,formatSizes[lVar11].height);
              tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pTVar6);
              std::__cxx11::string::~string((string *)&name_4);
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&name);
    }
    format = format + COMPRESSEDTEXFORMAT_EAC_R11;
    CVar4 = format;
  }
  return CVar4;
}

Assistant:

void TextureWrapTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} filteringModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// RGBA8 cases.
	{
		static const struct
		{
			const char*		name;
			int				width;
			int				height;
		} rgba8Sizes[] =
		{
			{ "pot",		64, 128 },
			{ "npot",		63, 112 }
		};

		{
			TestCaseGroup* const rgba8Group = new TestCaseGroup(m_context, "rgba8", "");
			addChild(rgba8Group);

			FOR_EACH(size,		rgba8Sizes,
			FOR_EACH(wrapS,		wrapModes,
			FOR_EACH(wrapT,		wrapModes,
			FOR_EACH(filter,	filteringModes,
				{
					const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + rgba8Sizes[size].name;
					rgba8Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
															 GL_RGBA, GL_UNSIGNED_BYTE,
															 wrapModes[wrapS].mode,
															 wrapModes[wrapT].mode,
															 filteringModes[filter].mode, filteringModes[filter].mode,
															 rgba8Sizes[size].width, rgba8Sizes[size].height));

				}))));
		}
	}

	// ETC1 cases.
	{
		TestCaseGroup* const etc1Group = new TestCaseGroup(m_context, "etc1", "");
		addChild(etc1Group);

		// Power-of-two ETC1 texture
		std::vector<std::string> potFilenames;
		potFilenames.push_back("data/etc1/photo_helsinki_mip_0.pkm");

		FOR_EACH(wrapS,		wrapModes,
		FOR_EACH(wrapT,		wrapModes,
		FOR_EACH(filter,	filteringModes,
			{
				const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_pot";
				etc1Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
														wrapModes[wrapS].mode,
														wrapModes[wrapT].mode,
														filteringModes[filter].mode, filteringModes[filter].mode,
														potFilenames));

			})));

		std::vector<std::string> npotFilenames;
		npotFilenames.push_back("data/etc1/photo_helsinki_113x89.pkm");

		// NPOT ETC1 texture
		FOR_EACH(wrapS,		wrapModes,
		FOR_EACH(wrapT,		wrapModes,
		FOR_EACH(filter,	filteringModes,
			{
				const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_npot";
				etc1Group->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
														wrapModes[wrapS].mode,
														wrapModes[wrapT].mode,
														filteringModes[filter].mode, filteringModes[filter].mode,
														npotFilenames));
			})));
	}

	// ETC-2 (and EAC) cases.
	{
		static const struct
		{
			const char*			name;
			CompressedTexFormat	format;
		} etc2Formats[] =
		{
			{ "eac_r11",							tcu::COMPRESSEDTEXFORMAT_EAC_R11,							},
			{ "eac_signed_r11",						tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11,					},
			{ "eac_rg11",							tcu::COMPRESSEDTEXFORMAT_EAC_RG11,							},
			{ "eac_signed_rg11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11,					},
			{ "etc2_rgb8",							tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8,							},
			{ "etc2_srgb8",							tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8,						},
			{ "etc2_rgb8_punchthrough_alpha1",		tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1,		},
			{ "etc2_srgb8_punchthrough_alpha1",		tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1,	},
			{ "etc2_eac_rgba8",						tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8,					},
			{ "etc2_eac_srgb8_alpha8",				tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8,				}
		};

		static const struct
		{
			const char*		name;
			int				width;
			int				height;
		} etc2Sizes[] =
		{
			{ "pot",	64,		128	},
			{ "npot",	123,	107	}
		};

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
		{
			TestCaseGroup* const formatGroup = new TestCaseGroup(m_context, etc2Formats[formatNdx].name, "");
			addChild(formatGroup);

			FOR_EACH(size,		etc2Sizes,
			FOR_EACH(wrapS,		wrapModes,
			FOR_EACH(wrapT,		wrapModes,
			FOR_EACH(filter,	filteringModes,
				{
					const string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + etc2Sizes[size].name;
					formatGroup->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
															  etc2Formats[formatNdx].format,
															  wrapModes[wrapS].mode,
															  wrapModes[wrapT].mode,
															  filteringModes[filter].mode, filteringModes[filter].mode,
															  etc2Sizes[size].width, etc2Sizes[size].height));
				}))));
		}
	}

	// ASTC cases.
	{
		for (int formatI = 0; formatI < tcu::COMPRESSEDTEXFORMAT_LAST; formatI++)
		{
			const CompressedTexFormat format = (CompressedTexFormat)formatI;

			if (!tcu::isAstcFormat(format))
				continue;

			{
				const tcu::IVec3		blockSize		= tcu::getBlockPixelSize(format);
				const string			formatName		= "astc_" + de::toString(blockSize.x()) + "x" + de::toString(blockSize.y()) + (tcu::isAstcSRGBFormat(format) ? "_srgb" : "");
				TestCaseGroup* const	formatGroup		= new TestCaseGroup(m_context, formatName.c_str(), "");
				addChild(formatGroup);

				DE_ASSERT(blockSize.z() == 1);

				// \note This array is NOT static.
				const struct
				{
					const char*		name;
					int				width;
					int				height;
				} formatSizes[] =
				{
					{ "divisible",		blockSize.x()*10,		blockSize.y()*10	},
					{ "not_divisible",	blockSize.x()*10+1,		blockSize.y()*10+1	},
				};

				FOR_EACH(size,		formatSizes,
				FOR_EACH(wrapS,		wrapModes,
				FOR_EACH(wrapT,		wrapModes,
				FOR_EACH(filter,	filteringModes,
					{
						string name = string("") + wrapModes[wrapS].name + "_" + wrapModes[wrapT].name + "_" + filteringModes[filter].name + "_" + formatSizes[size].name;
						formatGroup->addChild(new TextureWrapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), name.c_str(), "",
																  format,
																  wrapModes[wrapS].mode,
																  wrapModes[wrapT].mode,
																  filteringModes[filter].mode, filteringModes[filter].mode,
																  formatSizes[size].width, formatSizes[size].height));
					}))));
			}
		}
	}
}